

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O1

int __thiscall CppJieba::MixSegment::init(MixSegment *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  string local_30;
  
  if ((this->super_SegmentBase)._isInited == true) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"inited.","");
    Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x1d,&local_30);
  }
  else {
    iVar2 = MPSegment::init(&this->_mpSeg,ctx);
    if ((char)iVar2 == '\0') {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"_mpSeg init","");
      Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x22,&local_30);
    }
    else {
      bVar1 = HMMSegment::_loadModel(&this->_hmmSeg,(this->_hmmSeg)._hmmModelPath._M_dataplus._M_p);
      (this->_hmmSeg).super_SegmentBase._isInited = bVar1;
      if (bVar1) {
        (this->super_SegmentBase)._isInited = true;
        return (int)CONCAT71(extraout_var,1);
      }
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"_hmmSeg init","");
      Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x27,&local_30);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

virtual bool init()
            {
                if(_getInitFlag())
                {
                    LogError("inited.");
                    return false;
                }
                if(!_mpSeg.init())
                {
                    LogError("_mpSeg init");
                    return false;
                }
                if(!_hmmSeg.init())
                {
                    LogError("_hmmSeg init");
                    return false;
                }
                return _setInitFlag(true);
            }